

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

void __thiscall
KryoFlux::ReadFlux(KryoFlux *this,int revs,FluxData *flux_revs,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *warnings)

{
  int iVar1;
  int *piVar2;
  uchar *puVar3;
  FluxData local_108;
  string local_f0 [32];
  uchar *local_d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  uchar *local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  const_iterator local_a8;
  int local_9c;
  string local_98 [4];
  int len;
  allocator<unsigned_char> local_71;
  undefined1 local_70 [8];
  Data chunk;
  undefined1 local_48 [8];
  Data track_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *warnings_local;
  FluxData *flux_revs_local;
  KryoFlux *pKStack_10;
  int revs_local;
  KryoFlux *this_local;
  
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1;
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x14;
  flux_revs_local._4_4_ = revs;
  pKStack_10 = this;
  piVar2 = std::min<int>((int *)((long)&flux_revs_local + 4),
                         (int *)&track_data.
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  piVar2 = std::max<int>((int *)((long)&track_data.
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                         piVar2);
  flux_revs_local._4_4_ = *piVar2;
  Data::Data((Data *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,1000000);
  std::allocator<unsigned_char>::allocator(&local_71);
  Data::vector((Data *)local_70,0x10000,&local_71);
  std::allocator<unsigned_char>::~allocator(&local_71);
  (**(code **)(*(long *)this + 0x38))();
  (**(code **)(*(long *)this + 0x18))(local_98,this,0xb,flux_revs_local._4_4_ * 0x100 + 0x101,0);
  std::__cxx11::string::~string(local_98);
  do {
    do {
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      iVar1 = Data::size((Data *)local_70);
      local_9c = (**(code **)(*(long *)this + 0x30))(this,puVar3,iVar1);
      local_b0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_a8,&local_b0);
      local_b8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      local_c8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      local_c0 = (uchar *)__gnu_cxx::
                          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator+(&local_c8,(long)local_9c);
      local_d0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                          insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48
                                     ,local_a8,local_b8,
                                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      )local_c0);
    } while (local_9c < 7);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    iVar1 = memcmp(puVar3 + (long)local_9c + -7,"\r\r\r\r\r\r\r",7);
  } while (iVar1 != 0);
  (**(code **)(*(long *)this + 0x18))(local_f0,this,0xb,0);
  std::__cxx11::string::~string(local_f0);
  (**(code **)(*(long *)this + 0x40))();
  DecodeStream(&local_108,(Data *)local_48,warnings);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(flux_revs,&local_108);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_108);
  Data::~Data((Data *)local_70);
  Data::~Data((Data *)local_48);
  return;
}

Assistant:

void KryoFlux::ReadFlux(int revs, FluxData& flux_revs, std::vector<std::string>& warnings)
{
    revs = std::max(1, std::min(revs, 20));

    Data track_data;
    track_data.reserve(1'000'000);
    Data chunk(0x10000);

    // Start reading before we ask for the bulk data.
    StartAsyncRead();

    // Start stream, for 1 more index hole than we require revolutions
    Control(REQ_STREAM, ((revs + 1) << 8) | 0x01);

    for (;;)
    {
        auto len = ReadAsync(chunk.data(), chunk.size());
        track_data.insert(track_data.end(), chunk.begin(), chunk.begin() + len);

        // Check for end marker at end of current packet.
        // ToDo: parse this properly, due to small risk of false positives.
        if (len >= 7 && !memcmp(chunk.data() + len - 7, "\xd\xd\xd\xd\xd\xd\xd", 7))
        {
            // Stop streaming and finish
            Control(REQ_STREAM, 0);
            StopAsyncRead();
            break;
        }
    }

    // Decode the track data to multiple flux revolutions, plus any warnings
    flux_revs = DecodeStream(track_data, warnings);
}